

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FE_Insert_Character(FORM *form)

{
  FIELD *field_00;
  _Bool _Var1;
  int local_1c;
  _Bool There_Is_Room;
  int result;
  FIELD *field;
  FORM *form_local;
  
  field_00 = form->current;
  local_1c = -0xc;
  _Var1 = Check_Char(field_00->type,0x20,(TypeArgument *)field_00->arg);
  if ((_Var1) &&
     ((_Var1 = Is_There_Room_For_A_Char_In_Line(form), _Var1 ||
      (((int)field_00->rows + field_00->nrow == 1 && ((field_00->status & 8) != 0)))))) {
    if ((_Var1) || (_Var1 = Field_Grown(field_00,1), _Var1)) {
      winsch(form->w,0x20);
      local_1c = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
    }
    else {
      local_1c = -1;
    }
  }
  return local_1c;
}

Assistant:

static int FE_Insert_Character(FORM * form)
{
  FIELD *field = form->current;
  int result = E_REQUEST_DENIED;

  if (Check_Char(field->type,(int)C_BLANK,(TypeArgument *)(field->arg)))
    {
      bool There_Is_Room = Is_There_Room_For_A_Char_In_Line(form);

      if (There_Is_Room ||
          ((Single_Line_Field(field) && Growable(field))))
        {
          if (!There_Is_Room && !Field_Grown(field,1))
            result =  E_SYSTEM_ERROR;
          else
            {
              winsch(form->w,(chtype)C_BLANK);
              result = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
            }
        }
    }
  return result;
}